

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::SummarizeLinearOffsets
          (BamStandardIndex *this,BaiReferenceSummary *refSummary)

{
  int64_t iVar1;
  long in_RSI;
  BamStandardIndex *in_RDI;
  int numLinearOffsets;
  int *in_stack_00000058;
  BamStandardIndex *in_stack_00000060;
  int *in_stack_ffffffffffffffd8;
  undefined4 local_14;
  
  ReadNumLinearOffsets(in_stack_00000060,in_stack_00000058);
  *(undefined4 *)(in_RSI + 4) = local_14;
  iVar1 = Tell((BamStandardIndex *)0x1b8d98);
  *(int64_t *)(in_RSI + 0x10) = iVar1;
  SkipLinearOffsets(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void BamStandardIndex::SummarizeLinearOffsets(BaiReferenceSummary& refSummary) {

    // load number of linear offsets
    int numLinearOffsets;
    ReadNumLinearOffsets(numLinearOffsets);

    // store bin summary data for this reference
    refSummary.NumLinearOffsets = numLinearOffsets;
    refSummary.FirstLinearOffsetFilePosition = Tell();

    // skip linear offsets in index file
    SkipLinearOffsets(numLinearOffsets);
}